

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3RunVacuum(char **pzErrMsg,sqlite3 *db,int iDb,sqlite3_value *pOut)

{
  u16 *puVar1;
  u8 uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  Btree *p;
  Pager *pPVar6;
  Btree *p_00;
  sqlite3_file *psVar7;
  sqlite3_io_methods *psVar8;
  BtShared *pBVar9;
  Db *pDVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uchar *puVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  u32 meta;
  Db *local_a0;
  long local_98;
  ulong local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  i64 sz;
  Btree *pBStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  sqlite3 *local_58;
  Btree *pBStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  sqlite3_backup *local_38;
  
  if (db->autoCommit == '\0') {
    pcVar15 = "cannot VACUUM from within a transaction";
  }
  else {
    if (db->nVdbeActive < 2) {
      uVar4 = db->openFlags;
      if (pOut == (sqlite3_value *)0x0) {
        puVar14 = "";
      }
      else {
        uVar5._0_2_ = pOut->flags;
        uVar5._2_1_ = pOut->enc;
        uVar5._3_1_ = pOut->eSubtype;
        if ((0x4000400040004U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          pcVar15 = "non-text filename";
          goto LAB_0013e018;
        }
        puVar14 = sqlite3_value_text(pOut);
        db->openFlags = db->openFlags & 0xfffffff8 | 6;
      }
      local_90 = db->flags;
      uVar5 = db->mDbFlags;
      local_88 = (undefined4)db->nChange;
      uStack_84 = *(undefined4 *)((long)&db->nChange + 4);
      uStack_80 = (undefined4)db->nTotalChange;
      uStack_7c = *(undefined4 *)((long)&db->nTotalChange + 4);
      uVar2 = db->mTrace;
      db->mDbFlags = uVar5 | 6;
      db->flags = local_90 & 0xfffffffeefffadfe | 0x201;
      db->mTrace = '\0';
      p = db->aDb[iDb].pBt;
      pPVar6 = p->pBt->pPager;
      if (pPVar6->tempFile == '\0') {
        bVar18 = pPVar6->memVfs == '\0';
      }
      else {
        bVar18 = false;
      }
      pcVar15 = db->aDb[iDb].zDbSName;
      lVar16 = (long)db->nDb;
      local_a0 = (Db *)0x0;
      iVar11 = execSqlF(db,pzErrMsg,"ATTACH %Q AS vacuum_db",puVar14);
      db->openFlags = uVar4;
      if (iVar11 == 0) {
        local_a0 = db->aDb + lVar16;
        p_00 = db->aDb[lVar16].pBt;
        if (pOut != (sqlite3_value *)0x0) {
          psVar7 = p_00->pBt->pPager->fd;
          sz = 0;
          psVar8 = psVar7->pMethods;
          if ((psVar8 != (sqlite3_io_methods *)0x0) &&
             ((iVar11 = (*psVar8->xFileSize)(psVar7,&sz), iVar11 != 0 || (0 < sz)))) {
            sqlite3SetString(pzErrMsg,db,"output file already exists");
            iVar11 = 1;
            goto LAB_0013e25b;
          }
          *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 8;
        }
        local_98 = lVar16;
        iVar12 = sqlite3BtreeGetRequestedReserve(p);
        sqlite3BtreeSetCacheSize(p_00,(db->aDb[iDb].pSchema)->cache_size);
        iVar11 = sqlite3BtreeSetSpillSize(p,0);
        sqlite3BtreeSetSpillSize(p_00,iVar11);
        sqlite3BtreeSetPagerFlags(p_00,0x21);
        iVar11 = execSql(db,pzErrMsg,"BEGIN");
        if ((iVar11 == 0) &&
           (iVar11 = sqlite3BtreeBeginTrans(p,(uint)(pOut == (sqlite3_value *)0x0) * 2,(int *)0x0),
           iVar11 == 0)) {
          pBVar9 = p->pBt;
          if ((pOut == (sqlite3_value *)0x0) && (pBVar9->pPager->journalMode == '\x05')) {
            db->nextPagesize = 0;
          }
          iVar13 = sqlite3BtreeSetPageSize(p_00,pBVar9->pageSize,iVar12,0);
          iVar11 = 7;
          if ((iVar13 == 0) &&
             (((!bVar18 ||
               (iVar12 = sqlite3BtreeSetPageSize(p_00,db->nextPagesize,iVar12,0), iVar12 == 0)) &&
              (db->mallocFailed == '\0')))) {
            iVar11 = (int)db->nextAutovac;
            if (db->nextAutovac < '\0') {
              iVar11 = sqlite3BtreeGetAutoVacuum(p);
            }
            sqlite3BtreeSetAutoVacuum(p_00,iVar11);
            (db->init).iDb = (u8)local_98;
            iVar11 = execSqlF(db,pzErrMsg,
                              "SELECT sql FROM \"%w\".sqlite_schema WHERE type=\'table\'AND name<>\'sqlite_sequence\' AND coalesce(rootpage,1)>0"
                              ,pcVar15);
            if ((iVar11 == 0) &&
               (iVar11 = execSqlF(db,pzErrMsg,
                                  "SELECT sql FROM \"%w\".sqlite_schema WHERE type=\'index\'",
                                  pcVar15), iVar11 == 0)) {
              (db->init).iDb = '\0';
              iVar11 = execSqlF(db,pzErrMsg,
                                "SELECT\'INSERT INTO vacuum_db.\'||quote(name)||\' SELECT*FROM\"%w\".\'||quote(name)FROM vacuum_db.sqlite_schema WHERE type=\'table\'AND coalesce(rootpage,1)>0"
                                ,pcVar15);
              *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfb;
              if ((iVar11 == 0) &&
                 (iVar11 = execSqlF(db,pzErrMsg,
                                    "INSERT INTO vacuum_db.sqlite_schema SELECT*FROM \"%w\".sqlite_schema WHERE type IN(\'view\',\'trigger\') OR(type=\'table\'AND rootpage=0)"
                                    ,pcVar15), iVar11 == 0)) {
                uVar17 = 0;
                do {
                  if (9 < uVar17) {
                    if (pOut == (sqlite3_value *)0x0) {
                      sqlite3BtreeEnter(p);
                      sqlite3BtreeEnter(p_00);
                      psVar7 = p->pBt->pPager->fd;
                      psVar8 = psVar7->pMethods;
                      if (psVar8 == (sqlite3_io_methods *)0x0) {
LAB_0013e4a1:
                        local_48._0_4_ = 0;
                        local_48._4_4_ = 0;
                        uStack_40._0_4_ = 0;
                        uStack_40._4_4_ = 0;
                        local_68._0_4_ = 0;
                        local_68._4_4_ = 0;
                        sz = 0;
                        local_38 = (sqlite3_backup *)0x0;
                        local_58 = p_00->db;
                        uStack_60._0_4_ = 1;
                        uStack_60._4_4_ = 0;
                        pBStack_70 = p;
                        pBStack_50 = p_00;
                        sqlite3_backup_step((sqlite3_backup *)&sz,0x7fffffff);
                        iVar11 = sqlite3_backup_finish((sqlite3_backup *)&sz);
                        if (iVar11 == 0) {
                          puVar1 = &p->pBt->btsFlags;
                          *puVar1 = *puVar1 & 0xfffd;
                          iVar11 = 0;
                        }
                        else {
                          pPVar6 = pBStack_70->pBt->pPager;
                          if (pPVar6->tempFile == '\0') {
                            pager_reset(pPVar6);
                          }
                        }
                      }
                      else {
                        sz = (ulong)p_00->pBt->nPage * (long)(int)p_00->pBt->pageSize;
                        iVar11 = (*psVar8->xFileControl)(psVar7,0xb,&sz);
                        if ((iVar11 == 0xc) || (iVar11 == 0)) goto LAB_0013e4a1;
                      }
                      sqlite3BtreeLeave(p_00);
                      sqlite3BtreeLeave(p);
                      if (iVar11 != 0) break;
                    }
                    iVar11 = sqlite3BtreeCommit(p_00);
                    bVar18 = iVar11 == 0;
                    if ((pOut == (sqlite3_value *)0x0) && (iVar11 == 0)) {
                      iVar12 = sqlite3BtreeGetAutoVacuum(p_00);
                      sqlite3BtreeSetAutoVacuum(p,iVar12);
                      bVar18 = true;
                    }
                    if ((pOut == (sqlite3_value *)0x0) && (bVar18)) {
                      iVar11 = sqlite3BtreeGetRequestedReserve(p_00);
                      iVar11 = sqlite3BtreeSetPageSize(p,p_00->pBt->pageSize,iVar11,1);
                    }
                    break;
                  }
                  bVar3 = "\x01\x01\x03"[uVar17];
                  sqlite3BtreeGetMeta(p,(uint)bVar3,&meta);
                  iVar11 = sqlite3BtreeUpdateMeta
                                     (p_00,(uint)bVar3,"\x01\x01\x03"[uVar17 + 1] + meta);
                  uVar17 = uVar17 + 2;
                } while (iVar11 == 0);
              }
            }
          }
        }
      }
LAB_0013e25b:
      (db->init).iDb = '\0';
      db->mDbFlags = uVar5;
      db->flags = local_90;
      db->nChange = CONCAT44(uStack_84,local_88);
      db->nTotalChange = CONCAT44(uStack_7c,uStack_80);
      db->mTrace = uVar2;
      sqlite3BtreeSetPageSize(p,-1,0,1);
      pDVar10 = local_a0;
      db->autoCommit = '\x01';
      if (local_a0 != (Db *)0x0) {
        sqlite3BtreeClose(local_a0->pBt);
        pDVar10->pBt = (Btree *)0x0;
        pDVar10->pSchema = (Schema *)0x0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      return iVar11;
    }
    pcVar15 = "cannot VACUUM - SQL statements in progress";
  }
LAB_0013e018:
  sqlite3SetString(pzErrMsg,db,pcVar15);
  return 1;
}

Assistant:

int sqlite3RunVacuum(
  char **pzErrMsg,        /* Write error message here */
  sqlite3 *db,            /* Database connection */
  int iDb,                /* Which attached DB to vacuum */
  sqlite3_value *pOut     /* Write results here, if not NULL. VACUUM INTO */
){
  int rc = SQLITE_OK;     /* Return code from service routines */
  Btree *pMain;           /* The database being vacuumed */
  Btree *pTemp;           /* The temporary database we vacuum into */
  u32 saved_mDbFlags;     /* Saved value of db->mDbFlags */
  u64 saved_flags;        /* Saved value of db->flags */
  i64 saved_nChange;      /* Saved value of db->nChange */
  i64 saved_nTotalChange; /* Saved value of db->nTotalChange */
  u32 saved_openFlags;    /* Saved value of db->openFlags */
  u8 saved_mTrace;        /* Saved trace settings */
  Db *pDb = 0;            /* Database to detach at end of vacuum */
  int isMemDb;            /* True if vacuuming a :memory: database */
  int nRes;               /* Bytes of reserved space at the end of each page */
  int nDb;                /* Number of attached databases */
  const char *zDbMain;    /* Schema name of database to vacuum */
  const char *zOut;       /* Name of output file */

  if( !db->autoCommit ){
    sqlite3SetString(pzErrMsg, db, "cannot VACUUM from within a transaction");
    return SQLITE_ERROR; /* IMP: R-12218-18073 */
  }
  if( db->nVdbeActive>1 ){
    sqlite3SetString(pzErrMsg, db,"cannot VACUUM - SQL statements in progress");
    return SQLITE_ERROR; /* IMP: R-15610-35227 */
  }
  saved_openFlags = db->openFlags;
  if( pOut ){
    if( sqlite3_value_type(pOut)!=SQLITE_TEXT ){
      sqlite3SetString(pzErrMsg, db, "non-text filename");
      return SQLITE_ERROR;
    }
    zOut = (const char*)sqlite3_value_text(pOut);
    db->openFlags &= ~SQLITE_OPEN_READONLY;
    db->openFlags |= SQLITE_OPEN_CREATE|SQLITE_OPEN_READWRITE;
  }else{
    zOut = "";
  }

  /* Save the current value of the database flags so that it can be
  ** restored before returning. Then set the writable-schema flag, and
  ** disable CHECK and foreign key constraints.  */
  saved_flags = db->flags;
  saved_mDbFlags = db->mDbFlags;
  saved_nChange = db->nChange;
  saved_nTotalChange = db->nTotalChange;
  saved_mTrace = db->mTrace;
  db->flags |= SQLITE_WriteSchema | SQLITE_IgnoreChecks;
  db->mDbFlags |= DBFLAG_PreferBuiltin | DBFLAG_Vacuum;
  db->flags &= ~(u64)(SQLITE_ForeignKeys | SQLITE_ReverseOrder
                   | SQLITE_Defensive | SQLITE_CountRows);
  db->mTrace = 0;

  zDbMain = db->aDb[iDb].zDbSName;
  pMain = db->aDb[iDb].pBt;
  isMemDb = sqlite3PagerIsMemdb(sqlite3BtreePager(pMain));

  /* Attach the temporary database as 'vacuum_db'. The synchronous pragma
  ** can be set to 'off' for this file, as it is not recovered if a crash
  ** occurs anyway. The integrity of the database is maintained by a
  ** (possibly synchronous) transaction opened on the main database before
  ** sqlite3BtreeCopyFile() is called.
  **
  ** An optimisation would be to use a non-journaled pager.
  ** (Later:) I tried setting "PRAGMA vacuum_db.journal_mode=OFF" but
  ** that actually made the VACUUM run slower.  Very little journalling
  ** actually occurs when doing a vacuum since the vacuum_db is initially
  ** empty.  Only the journal header is written.  Apparently it takes more
  ** time to parse and run the PRAGMA to turn journalling off than it does
  ** to write the journal header file.
  */
  nDb = db->nDb;
  rc = execSqlF(db, pzErrMsg, "ATTACH %Q AS vacuum_db", zOut);
  db->openFlags = saved_openFlags;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  assert( (db->nDb-1)==nDb );
  pDb = &db->aDb[nDb];
  assert( strcmp(pDb->zDbSName,"vacuum_db")==0 );
  pTemp = pDb->pBt;
  if( pOut ){
    sqlite3_file *id = sqlite3PagerFile(sqlite3BtreePager(pTemp));
    i64 sz = 0;
    if( id->pMethods!=0 && (sqlite3OsFileSize(id, &sz)!=SQLITE_OK || sz>0) ){
      rc = SQLITE_ERROR;
      sqlite3SetString(pzErrMsg, db, "output file already exists");
      goto end_of_vacuum;
    }
    db->mDbFlags |= DBFLAG_VacuumInto;
  }
  nRes = sqlite3BtreeGetRequestedReserve(pMain);

  sqlite3BtreeSetCacheSize(pTemp, db->aDb[iDb].pSchema->cache_size);
  sqlite3BtreeSetSpillSize(pTemp, sqlite3BtreeSetSpillSize(pMain,0));
  sqlite3BtreeSetPagerFlags(pTemp, PAGER_SYNCHRONOUS_OFF|PAGER_CACHESPILL);

  /* Begin a transaction and take an exclusive lock on the main database
  ** file. This is done before the sqlite3BtreeGetPageSize(pMain) call below,
  ** to ensure that we do not try to change the page-size on a WAL database.
  */
  rc = execSql(db, pzErrMsg, "BEGIN");
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = sqlite3BtreeBeginTrans(pMain, pOut==0 ? 2 : 0, 0);
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Do not attempt to change the page size for a WAL database */
  if( sqlite3PagerGetJournalMode(sqlite3BtreePager(pMain))
                                               ==PAGER_JOURNALMODE_WAL
   && pOut==0
  ){
    db->nextPagesize = 0;
  }

  if( sqlite3BtreeSetPageSize(pTemp, sqlite3BtreeGetPageSize(pMain), nRes, 0)
   || (!isMemDb && sqlite3BtreeSetPageSize(pTemp, db->nextPagesize, nRes, 0))
   || NEVER(db->mallocFailed)
  ){
    rc = SQLITE_NOMEM_BKPT;
    goto end_of_vacuum;
  }

#ifndef SQLITE_OMIT_AUTOVACUUM
  sqlite3BtreeSetAutoVacuum(pTemp, db->nextAutovac>=0 ? db->nextAutovac :
                                           sqlite3BtreeGetAutoVacuum(pMain));
#endif

  /* Query the schema of the main database. Create a mirror schema
  ** in the temporary database.
  */
  db->init.iDb = nDb; /* force new CREATE statements into vacuum_db */
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_schema"
      " WHERE type='table'AND name<>'sqlite_sequence'"
      " AND coalesce(rootpage,1)>0",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_schema"
      " WHERE type='index'",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  db->init.iDb = 0;

  /* Loop through the tables in the main database. For each, do
  ** an "INSERT INTO vacuum_db.xxx SELECT * FROM main.xxx;" to copy
  ** the contents to the temporary database.
  */
  rc = execSqlF(db, pzErrMsg,
      "SELECT'INSERT INTO vacuum_db.'||quote(name)"
      "||' SELECT*FROM\"%w\".'||quote(name)"
      "FROM vacuum_db.sqlite_schema "
      "WHERE type='table'AND coalesce(rootpage,1)>0",
      zDbMain
  );
  assert( (db->mDbFlags & DBFLAG_Vacuum)!=0 );
  db->mDbFlags &= ~DBFLAG_Vacuum;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Copy the triggers, views, and virtual tables from the main database
  ** over to the temporary database.  None of these objects has any
  ** associated storage, so all we have to do is copy their entries
  ** from the schema table.
  */
  rc = execSqlF(db, pzErrMsg,
      "INSERT INTO vacuum_db.sqlite_schema"
      " SELECT*FROM \"%w\".sqlite_schema"
      " WHERE type IN('view','trigger')"
      " OR(type='table'AND rootpage=0)",
      zDbMain
  );
  if( rc ) goto end_of_vacuum;

  /* At this point, there is a write transaction open on both the
  ** vacuum database and the main database. Assuming no error occurs,
  ** both transactions are closed by this block - the main database
  ** transaction by sqlite3BtreeCopyFile() and the other by an explicit
  ** call to sqlite3BtreeCommit().
  */
  {
    u32 meta;
    int i;

    /* This array determines which meta meta values are preserved in the
    ** vacuum.  Even entries are the meta value number and odd entries
    ** are an increment to apply to the meta value after the vacuum.
    ** The increment is used to increase the schema cookie so that other
    ** connections to the same database will know to reread the schema.
    */
    static const unsigned char aCopy[] = {
       BTREE_SCHEMA_VERSION,     1,  /* Add one to the old schema cookie */
       BTREE_DEFAULT_CACHE_SIZE, 0,  /* Preserve the default page cache size */
       BTREE_TEXT_ENCODING,      0,  /* Preserve the text encoding */
       BTREE_USER_VERSION,       0,  /* Preserve the user version */
       BTREE_APPLICATION_ID,     0,  /* Preserve the application id */
    };

    assert( SQLITE_TXN_WRITE==sqlite3BtreeTxnState(pTemp) );
    assert( pOut!=0 || SQLITE_TXN_WRITE==sqlite3BtreeTxnState(pMain) );

    /* Copy Btree meta values */
    for(i=0; i<ArraySize(aCopy); i+=2){
      /* GetMeta() and UpdateMeta() cannot fail in this context because
      ** we already have page 1 loaded into cache and marked dirty. */
      sqlite3BtreeGetMeta(pMain, aCopy[i], &meta);
      rc = sqlite3BtreeUpdateMeta(pTemp, aCopy[i], meta+aCopy[i+1]);
      if( NEVER(rc!=SQLITE_OK) ) goto end_of_vacuum;
    }

    if( pOut==0 ){
      rc = sqlite3BtreeCopyFile(pMain, pTemp);
    }
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
    rc = sqlite3BtreeCommit(pTemp);
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pOut==0 ){
      sqlite3BtreeSetAutoVacuum(pMain, sqlite3BtreeGetAutoVacuum(pTemp));
    }
#endif
  }

  assert( rc==SQLITE_OK );
  if( pOut==0 ){
    nRes = sqlite3BtreeGetRequestedReserve(pTemp);
    rc = sqlite3BtreeSetPageSize(pMain, sqlite3BtreeGetPageSize(pTemp), nRes,1);
  }

end_of_vacuum:
  /* Restore the original value of db->flags */
  db->init.iDb = 0;
  db->mDbFlags = saved_mDbFlags;
  db->flags = saved_flags;
  db->nChange = saved_nChange;
  db->nTotalChange = saved_nTotalChange;
  db->mTrace = saved_mTrace;
  sqlite3BtreeSetPageSize(pMain, -1, 0, 1);

  /* Currently there is an SQL level transaction open on the vacuum
  ** database. No locks are held on any other files (since the main file
  ** was committed at the btree level). So it safe to end the transaction
  ** by manually setting the autoCommit flag to true and detaching the
  ** vacuum database. The vacuum_db journal file is deleted when the pager
  ** is closed by the DETACH.
  */
  db->autoCommit = 1;

  if( pDb ){
    sqlite3BtreeClose(pDb->pBt);
    pDb->pBt = 0;
    pDb->pSchema = 0;
  }

  /* This both clears the schemas and reduces the size of the db->aDb[]
  ** array. */
  sqlite3ResetAllSchemasOfConnection(db);

  return rc;
}